

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtmelSWITypes.cpp
# Opt level: O2

char * GetFlagName(SWI_Flag flag)

{
  if (flag == SWIF_Sleep) {
    return "Sleep";
  }
  if (flag == SWIF_Transmit) {
    return "Transmit";
  }
  if (flag == SWIF_Idle) {
    return "Idle";
  }
  if (flag == SWIF_Command) {
    return "Command";
  }
  return "<unknown>";
}

Assistant:

const char* GetFlagName( SWI_Flag flag )
{
    switch( flag )
    {
    case SWIF_Transmit:
        return "Transmit";
    case SWIF_Command:
        return "Command";
    case SWIF_Idle:
        return "Idle";
    case SWIF_Sleep:
        return "Sleep";
    };

    return "<unknown>";
}